

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcache.hpp
# Opt level: O1

void __thiscall
CorUnix::CSHRSynchCache<CorUnix::_WaitingThreadsListNode>::Flush
          (CSHRSynchCache<CorUnix::_WaitingThreadsListNode> *this,CPalThread *pthrCurrent,
          bool fDontLock)

{
  _USHRSynchCacheStackNode *p_Var1;
  _USHRSynchCacheStackNode *p_Var2;
  undefined3 in_register_00000011;
  
  if (CONCAT31(in_register_00000011,fDontLock) == 0) {
    InternalEnterCriticalSection(pthrCurrent,&this->m_cs);
  }
  p_Var1 = (this->m_pHead).m_val;
  (this->m_pHead).m_val = (_USHRSynchCacheStackNode *)0x0;
  (this->m_iDepth).m_val = 0;
  if (!fDontLock) {
    InternalLeaveCriticalSection(pthrCurrent,&this->m_cs);
  }
  while (p_Var1 != (_USHRSynchCacheStackNode *)0x0) {
    p_Var2 = (p_Var1->pointers).pNext;
    SHMfree(*(SHMPTR *)((long)p_Var1 + 8));
    p_Var1 = p_Var2;
  }
  return;
}

Assistant:

void Flush(CPalThread * pthrCurrent, bool fDontLock = false)
        {
            USHRSynchCacheStackNode * pNode, * pTemp;
            SharedID shridTemp;

            if (!fDontLock)
            {
                Lock(pthrCurrent);
            }
            pNode = m_pHead;
            m_pHead = NULL;
            m_iDepth = 0;
            if (!fDontLock)
            {
                Unlock(pthrCurrent);
            }
            
            while (pNode)
            {
                pTemp = pNode;
                pNode = pNode->pointers.pNext;
                shridTemp = pTemp->pointers.shrid;
                RawSharedObjectFree(shridTemp);
            } 
        }